

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall
Transcript::AddWeights(Transcript *this,vector<double,_std::allocator<double>_> *weights)

{
  length_error *this_00;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1)) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->super_Polymer).polymerases_.weights_,weights);
    std::vector<double,_std::allocator<double>_>::operator=(&this->weights_,weights);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_a0,
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_80,"Provided weights not the correct size. ",&local_a0);
  std::operator+(&local_60,&local_80," ");
  std::__cxx11::to_string
            (&local_c0,((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1);
  std::operator+(&local_40,&local_60,&local_c0);
  std::length_error::length_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void Transcript::AddWeights(const std::vector<double> &weights) {
  if (weights.size() != (stop_ - start_ + 1)) { //start_ should always be 1
    throw std::length_error("Provided weights not the correct size. " +
                            std::to_string(weights.size()) + " " +
                            std::to_string(stop_ - start_ + 1));
  }
  polymerases_.set_weights(weights);
  weights_ = weights;
}